

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O2

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  ostream *poVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  string str;
  
  this->name_field_width_ = context->name_field_width;
  BenchmarkReporter::PrintBasicContext((this->super_BenchmarkReporter).error_stream_,context);
  FormatString_abi_cxx11_
            (&str,"%-*s %13s %13s %10s\n",(ulong)(uint)this->name_field_width_,"Benchmark","Time",
             "CPU","Iterations");
  poVar1 = std::operator<<((this->super_BenchmarkReporter).output_stream_,(string *)&str);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)str._M_string_length + -1);
  poVar1 = std::operator<<(poVar1,(string *)local_50);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&str);
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  PrintBasicContext(&GetErrorStream(), context);

#ifdef BENCHMARK_OS_WINDOWS
  if (color_output_ && &std::cout != &GetOutputStream()) {
      GetErrorStream() << "Color printing is only supported for stdout on windows."
                          " Disabling color printing\n";
      color_output_ = false;
  }
#endif
  std::string str = FormatString("%-*s %13s %13s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time", "CPU", "Iterations");
  GetOutputStream() << str << std::string(str.length() - 1, '-') << "\n";

  return true;
}